

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Scope * __thiscall soul::AST::Scope::findChildScope(Scope *this,IdentifierPath *path)

{
  ModuleBase *pMVar1;
  ArrayWithPreallocation<soul::Identifier,_8UL> *local_58;
  Scope local_48;
  Identifier *local_40;
  Identifier *p;
  Identifier *__end2;
  Identifier *__begin2;
  ArrayWithPreallocation<soul::Identifier,_8UL> *__range2;
  Scope *s;
  IdentifierPath *path_local;
  Scope *this_local;
  
  __begin2 = (Identifier *)path;
  __range2 = (ArrayWithPreallocation<soul::Identifier,_8UL> *)this;
  s = (Scope *)path;
  path_local = (IdentifierPath *)this;
  __end2 = ArrayWithPreallocation<soul::Identifier,_8UL>::begin(&path->pathSections);
  p = ArrayWithPreallocation<soul::Identifier,_8UL>::end
                ((ArrayWithPreallocation<soul::Identifier,_8UL> *)__begin2);
  while( true ) {
    if (__end2 == p) {
      return (Scope *)__range2;
    }
    local_40 = __end2;
    findSubModuleNamed(&local_48,(Identifier)__range2);
    pMVar1 = pool_ptr<soul::AST::ModuleBase>::get((pool_ptr<soul::AST::ModuleBase> *)&local_48);
    local_58 = (ArrayWithPreallocation<soul::Identifier,_8UL> *)0x0;
    if (pMVar1 != (ModuleBase *)0x0) {
      local_58 = (ArrayWithPreallocation<soul::Identifier,_8UL> *)&pMVar1->super_Scope;
    }
    __range2 = local_58;
    pool_ptr<soul::AST::ModuleBase>::~pool_ptr((pool_ptr<soul::AST::ModuleBase> *)&local_48);
    if (__range2 == (ArrayWithPreallocation<soul::Identifier,_8UL> *)0x0) break;
    __end2 = __end2 + 1;
  }
  return (Scope *)0x0;
}

Assistant:

const Scope* findChildScope (const IdentifierPath& path) const
        {
            const Scope* s = this;

            for (auto& p : path.pathSections)
            {
                s = s->findSubModuleNamed (p).get();

                if (s == nullptr)
                    break;
            }

            return s;
        }